

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O3

Symbol * ifnew_parminstall(char *name,char *num,char *units,char *limits)

{
  Symbol *n;
  ulong uVar1;
  
  n = lookup(name);
  if (n == (Symbol *)0x0) {
    n = install(name,0x13e);
    parminstall(n,num,units,limits);
  }
  uVar1 = n->subtype;
  if (uVar1 == 0) {
    parminstall(n,num,units,limits);
    uVar1 = n->subtype;
  }
  if (((uVar1 & 0x2002) == 0) && ((n != scop_indep || (scop_indep == indepsym)))) {
    diag(n->name," can\'t be declared a parameter by default");
  }
  return n;
}

Assistant:

void parminstall(n, num, units, limits)
	Symbol         *n;
	char           *num, *units, *limits;
{
	char buf[NRN_BUFSIZE];

	previous_subtype = n->subtype;	
	previous_str = n->u.str;
	if (n->u.str == (char *) 0)
		Lappendsym(syminorder, n);
	n->subtype |= PARM;
	Sprintf(buf, "\n%s\n%s\n%s\n", num, units, limits);
	n->u.str = stralloc(buf, (char *) 0);
}